

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O0

int Abc_NodeRemoveNonCurrentObjects(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *p;
  int local_20;
  int fVerbose;
  int i;
  int Counter;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  fVerbose = 0;
  for (local_20 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_20 < iVar1; local_20 = local_20 + 1) {
    p = Abc_NtkObj(pNtk,local_20);
    if ((p != (Abc_Obj_t *)0x0) && (iVar1 = Abc_NodeIsTravIdCurrent(p), iVar1 == 0)) {
      Abc_NtkDeleteObj(p);
      fVerbose = fVerbose + 1;
    }
  }
  return fVerbose;
}

Assistant:

int Abc_NodeRemoveNonCurrentObjects( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int Counter, i;
    int fVerbose = 0;

    // report on the nodes to be deleted
    if ( fVerbose )
    {
        printf( "These nodes will be deleted: \n" );
        Abc_NtkForEachObj( pNtk, pObj, i )
            if ( !Abc_NodeIsTravIdCurrent( pObj ) )
            {
                printf( "    " );
                Abc_ObjPrint( stdout, pObj );
            }
    }
    
    // delete the nodes    
    Counter = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_NodeIsTravIdCurrent( pObj ) )
        {
            Abc_NtkDeleteObj( pObj );
            Counter++;
        }
    return Counter;
}